

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_priority
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              nghttp2_priority_spec *pri_spec)

{
  nghttp2_mem *mem_00;
  nghttp2_outbound_item *in_RCX;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  nghttp2_mem *mem;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  nghttp2_priority_spec local_44;
  nghttp2_priority *local_38;
  nghttp2_priority *local_30;
  int local_24;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar1;
  int local_4;
  
  uVar1 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  mem_00 = (nghttp2_mem *)(in_RDI + 0xa08);
  if (*(int *)(in_RDI + 0xb40) == 1) {
    local_4 = 0;
  }
  else if ((in_EDX == 0) || (in_RCX == (nghttp2_outbound_item *)0x0)) {
    local_4 = -0x1f5;
  }
  else if (in_EDX == *(int *)&in_RCX->frame) {
    local_4 = -0x1f5;
  }
  else {
    local_44._0_8_ = (in_RCX->frame).hd.length;
    local_44._8_4_ = (in_RCX->frame).hd.stream_id;
    nghttp2_priority_spec_normalize_weight(&local_44);
    local_30 = (nghttp2_priority *)
               nghttp2_mem_malloc(mem_00,CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8));
    if (local_30 == (nghttp2_priority *)0x0) {
      local_4 = -0x385;
    }
    else {
      nghttp2_outbound_item_init((nghttp2_outbound_item *)0x11e828);
      local_38 = local_30;
      nghttp2_frame_priority_init
                ((nghttp2_priority *)mem_00,in_stack_ffffffffffffffac,
                 (nghttp2_priority_spec *)0x11e845);
      local_24 = nghttp2_session_add_item((nghttp2_session *)CONCAT44(uVar1,in_EDX),in_RCX);
      if (local_24 == 0) {
        local_4 = 0;
      }
      else {
        nghttp2_frame_priority_free(local_38);
        nghttp2_mem_free(mem_00,(void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ));
        local_4 = local_24;
      }
    }
  }
  return local_4;
}

Assistant:

int nghttp2_submit_priority(nghttp2_session *session, uint8_t flags,
                            int32_t stream_id,
                            const nghttp2_priority_spec *pri_spec) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_mem *mem;
  (void)flags;

  mem = &session->mem;

  if (session->remote_settings.no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || pri_spec == NULL) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == pri_spec->stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  copy_pri_spec = *pri_spec;

  nghttp2_priority_spec_normalize_weight(&copy_pri_spec);

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));

  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_priority_init(&frame->priority, stream_id, &copy_pri_spec);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_priority_free(&frame->priority);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;
}